

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

char * libssh2_session_banner_get(LIBSSH2_SESSION *session)

{
  LIBSSH2_SESSION *session_local;
  
  if (session == (LIBSSH2_SESSION *)0x0) {
    session_local = (LIBSSH2_SESSION *)0x0;
  }
  else if ((session->remote).banner == (uchar *)0x0) {
    session_local = (LIBSSH2_SESSION *)0x0;
  }
  else {
    session_local = (LIBSSH2_SESSION *)(session->remote).banner;
  }
  return (char *)session_local;
}

Assistant:

LIBSSH2_API const char *
libssh2_session_banner_get(LIBSSH2_SESSION *session)
{
    /* to avoid a coredump when session is NULL */
    if(!session)
        return NULL;

    if(!session->remote.banner)
        return NULL;

    return (const char *) session->remote.banner;
}